

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  int iVar1;
  long lVar2;
  int in_EDX;
  int in_ESI;
  PagerSavepoint *in_RDI;
  Pager *unaff_retaddr;
  PagerSavepoint *pSavepoint;
  i64 sz;
  PagerSavepoint *pRel;
  int nNew;
  int ii;
  int rc;
  i64 in_stack_ffffffffffffffb8;
  Bitvec *in_stack_ffffffffffffffc0;
  int local_18;
  u32 local_14;
  
  local_14 = in_RDI->aWalData[3];
  if ((local_14 == 0) && (in_EDX < *(int *)&in_RDI[2].pInSavepoint)) {
    iVar1 = in_EDX + (uint)(in_ESI != 1);
    for (local_18 = iVar1; local_18 < *(int *)&in_RDI[2].pInSavepoint; local_18 = local_18 + 1) {
      sqlite3BitvecDestroy(in_stack_ffffffffffffffc0);
    }
    *(int *)&in_RDI[2].pInSavepoint = iVar1;
    if (in_ESI == 1) {
      lVar2 = in_RDI[2].iHdrOffset + (long)iVar1 * 0x38;
      if ((*(int *)(lVar2 + 0x20) != 0) && (**(long **)&in_RDI[1].bTruncateOnRelease != 0)) {
        iVar1 = sqlite3JournalIsInMemory(*(sqlite3_file **)&in_RDI[1].bTruncateOnRelease);
        if (iVar1 != 0) {
          local_14 = sqlite3OsTruncate((sqlite3_file *)in_stack_ffffffffffffffc0,
                                       in_stack_ffffffffffffffb8);
        }
        *(undefined4 *)((long)&in_RDI[1].iOffset + 4) = *(undefined4 *)(lVar2 + 0x1c);
      }
    }
    else if ((in_RDI[5].pInSavepoint != (Bitvec *)0x0) || (**(long **)&in_RDI[1].nOrig != 0)) {
      local_14 = pagerPlaybackSavepoint(unaff_retaddr,in_RDI);
    }
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;

#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* Truncate the sub-journal so that it only includes the parts
    ** that are still in use. */
    if( op==SAVEPOINT_RELEASE ){
      PagerSavepoint *pRel = &pPager->aSavepoint[nNew];
      if( pRel->bTruncateOnRelease && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          i64 sz = (pPager->pageSize+4)*(i64)pRel->iSubRec;
          rc = sqlite3OsTruncate(pPager->sjfd, sz);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = pRel->iSubRec;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }

#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if(
        pPager->journalMode==PAGER_JOURNALMODE_OFF
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}